

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llb4Sweep.c
# Opt level: O3

DdManager *
Llb4_Nonlin4SweepGroups
          (Aig_Man_t *pAig,Vec_Int_t *vOrder,int nVars,Vec_Ptr_t **pvGroups,int nBddLimitClp,
          int fVerbose)

{
  Vec_Int_t *vVars2Q;
  DdManager *dd;
  Vec_Ptr_t *vParts;
  Vec_Ptr_t *pVVar1;
  
  vVars2Q = Llb_Nonlin4SweepVars2Q(pAig,vOrder,1);
  dd = Cudd_Init(nVars,0,0x100,0x40000,0);
  vParts = Llb_Nonlin4SweepPartitions(dd,pAig,vOrder,1);
  Cudd_AutodynEnable(dd,CUDD_REORDER_SYMM_SIFT);
  pVVar1 = Llb_Nonlin4Group(dd,vParts,vVars2Q,nBddLimitClp);
  *pvGroups = pVVar1;
  Llb_Nonlin4SweepDeref(dd,vParts);
  if (fVerbose != 0) {
    printf("Groups: ");
    Llb_Nonlin4SweepPrint(*pvGroups);
  }
  if (vVars2Q->pArray != (int *)0x0) {
    free(vVars2Q->pArray);
  }
  free(vVars2Q);
  return dd;
}

Assistant:

DdManager * Llb4_Nonlin4SweepGroups( Aig_Man_t * pAig, Vec_Int_t * vOrder, int nVars, Vec_Ptr_t ** pvGroups, int nBddLimitClp, int fVerbose )
{
    DdManager * dd;
    Vec_Ptr_t * vParts;
    Vec_Int_t * vVars2Q;
    // get quantifiable variables
    vVars2Q = Llb_Nonlin4SweepVars2Q( pAig, vOrder, 1 );
    // start BDD manager and create partitions 
    dd = Cudd_Init( nVars, 0, CUDD_UNIQUE_SLOTS, CUDD_CACHE_SLOTS, 0 );
    vParts = Llb_Nonlin4SweepPartitions( dd, pAig, vOrder, 1 );
//printf( "Transitions: " );
//Llb_Nonlin4SweepPrint( vParts );
    // compute image of the partitions

    Cudd_AutodynEnable( dd,  CUDD_REORDER_SYMM_SIFT );
    *pvGroups = Llb_Nonlin4Group( dd, vParts, vVars2Q, nBddLimitClp );
    Llb_Nonlin4SweepDeref( dd, vParts );
//    *pvGroups = vParts;

if ( fVerbose )
{
printf( "Groups: " );
Llb_Nonlin4SweepPrint( *pvGroups );
}

    Vec_IntFree( vVars2Q );
    return dd;
}